

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshfile_operations.cpp
# Opt level: O0

int swap_axes(map<int,_co_ordinates,_std::less<int>,_std::allocator<std::pair<const_int,_co_ordinates>_>_>
              *nodes_map)

{
  double dVar1;
  bool bVar2;
  pointer ppVar3;
  double dVar4;
  double y0;
  double x0;
  _Base_ptr local_38;
  _Base_ptr local_30;
  _Self local_28;
  double local_20;
  double offset;
  iterator nodes_it;
  map<int,_co_ordinates,_std::less<int>,_std::allocator<std::pair<const_int,_co_ordinates>_>_>
  *nodes_map_local;
  
  nodes_it._M_node = (_Base_ptr)nodes_map;
  offset = (double)std::
                   map<int,_co_ordinates,_std::less<int>,_std::allocator<std::pair<const_int,_co_ordinates>_>_>
                   ::begin(nodes_map);
  local_20 = 0.0;
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<int,_co_ordinates,_std::less<int>,_std::allocator<std::pair<const_int,_co_ordinates>_>_>
         ::end(nodes_it._M_node);
    bVar2 = std::operator!=((_Self *)&offset,&local_28);
    if (!bVar2) break;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_co_ordinates>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_int,_co_ordinates>_> *)&offset);
    if (local_20 < (ppVar3->second).co_ord[0]) {
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_co_ordinates>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_int,_co_ordinates>_> *)&offset);
      local_20 = (ppVar3->second).co_ord[0];
    }
    local_30 = (_Base_ptr)
               std::_Rb_tree_iterator<std::pair<const_int,_co_ordinates>_>::operator++
                         ((_Rb_tree_iterator<std::pair<const_int,_co_ordinates>_> *)&offset,0);
  }
  local_38 = (_Base_ptr)
             std::
             map<int,_co_ordinates,_std::less<int>,_std::allocator<std::pair<const_int,_co_ordinates>_>_>
             ::begin(nodes_it._M_node);
  offset = (double)local_38;
  while( true ) {
    x0 = (double)std::
                 map<int,_co_ordinates,_std::less<int>,_std::allocator<std::pair<const_int,_co_ordinates>_>_>
                 ::end((map<int,_co_ordinates,_std::less<int>,_std::allocator<std::pair<const_int,_co_ordinates>_>_>
                        *)nodes_it._M_node);
    bVar2 = std::operator!=((_Self *)&offset,(_Self *)&x0);
    if (!bVar2) break;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_co_ordinates>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_int,_co_ordinates>_> *)&offset);
    dVar4 = (ppVar3->second).co_ord[0];
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_co_ordinates>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_int,_co_ordinates>_> *)&offset);
    dVar1 = (ppVar3->second).co_ord[1];
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_co_ordinates>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_int,_co_ordinates>_> *)&offset);
    (ppVar3->second).co_ord[0] = dVar1;
    dVar4 = -dVar4 + local_20;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_co_ordinates>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_int,_co_ordinates>_> *)&offset);
    (ppVar3->second).co_ord[1] = dVar4;
    std::_Rb_tree_iterator<std::pair<const_int,_co_ordinates>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_int,_co_ordinates>_> *)&offset,0);
  }
  return 0;
}

Assistant:

int swap_axes(std::map<int, co_ordinates> &nodes_map)
{
    //first determine the offset of the grid.
    std::map<int, co_ordinates>::iterator nodes_it = nodes_map.begin();
    double offset = 0;
    while (nodes_it!=nodes_map.end())
    {
        if (nodes_it->second.co_ord[0]>offset)
            offset = nodes_it->second.co_ord[0];
        nodes_it++;
    }
    //then change [ x1, y1 ] to [y0,( -x0 + offset)]
    nodes_it = nodes_map.begin();
    while (nodes_it!=nodes_map.end())
    {
        double x0 = nodes_it->second.co_ord[0];
        double y0 = nodes_it->second.co_ord[1];
        nodes_it->second.co_ord[0] = y0;
        nodes_it->second.co_ord[1] = -x0+offset;
        nodes_it++;
    }
    return EXIT_SUCCESS;
}